

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

int Gia_ManFindAnnotatedDelay(Gia_Man_t *p,int DelayC,int *pnBoxes,int fIgnoreBoxDelays)

{
  Vec_Int_t *pVVar1;
  int *__ptr;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *__s;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  
  iVar3 = Gia_ManBoxNum(p);
  if (iVar3 == 0) {
    iVar3 = p->vCis->nSize;
  }
  else {
    iVar3 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
  }
  pVVar1 = p->vLevels;
  __ptr = pVVar1->pArray;
  uVar8 = p->nObjs;
  __s = __ptr;
  if (pVVar1->nCap < (int)uVar8) {
    if (__ptr == (int *)0x0) {
      __s = (int *)malloc((long)(int)uVar8 << 2);
    }
    else {
      __s = (int *)realloc(__ptr,(long)(int)uVar8 << 2);
    }
    pVVar1->pArray = __s;
    if (__s == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar1->nCap = uVar8;
  }
  if (0 < (int)uVar8) {
    memset(__s,0,(ulong)uVar8 * 4);
  }
  pVVar1->nSize = uVar8;
  iVar11 = 0;
  iVar9 = 0;
  if (1 < p->nObjs) {
    iVar9 = 0;
    uVar14 = 1;
    iVar11 = 0;
    do {
      uVar10 = *(ulong *)(p->pObjs + uVar14);
      uVar8 = (uint)uVar10;
      uVar13 = (uint)(uVar10 >> 0x20);
      if ((~uVar8 & 0x9fffffff) == 0) {
        if ((fIgnoreBoxDelays == 0) && (uVar8 = (uVar13 & 0x1fffffff) - iVar3, -1 < (int)uVar8)) {
          uVar13 = uVar8 >> 1;
          iVar4 = Gia_ManBoxNum(p);
          if (iVar4 <= (int)uVar13) {
            __assert_fail("iBox < Gia_ManBoxNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                          ,0x423,"int Gia_ManFindAnnotatedDelay(Gia_Man_t *, int, int *, int)");
          }
          uVar2 = uVar13 * 3;
          uVar7 = p->vCos->nSize;
          if (uVar7 == uVar2 || SBORROW4(uVar7,uVar2) != (int)(uVar7 + uVar13 * -3) < 0) {
            uVar7 = uVar2;
          }
          uVar10 = 0;
          iVar4 = 0;
          do {
            if (uVar7 + uVar13 * -3 == uVar10) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar5 = p->vCos->pArray[uVar2 + uVar10];
            uVar12 = (ulong)iVar5;
            if (((long)uVar12 < 0) || (p->nObjs <= iVar5)) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            if (uVar14 <= uVar12) {
              __assert_fail("Id < i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                            ,0x429,"int Gia_ManFindAnnotatedDelay(Gia_Man_t *, int, int *, int)");
            }
            if (iVar4 <= __ptr[uVar12]) {
              iVar4 = __ptr[uVar12];
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != 3);
          iVar5 = DelayC;
          if ((uVar8 & 1) == 0) {
            iVar5 = 100;
          }
          __ptr[uVar14] = iVar4 + iVar5;
        }
      }
      else {
        iVar4 = (int)uVar14;
        if ((~uVar8 & 0x1fffffff) == 0 || -1 < (int)uVar8) {
          if ((~uVar10 & 0x4000000040000000) == 0) {
            __assert_fail("!pObj->fMark0 || !pObj->fMark1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                          ,0x43a,"int Gia_ManFindAnnotatedDelay(Gia_Man_t *, int, int *, int)");
          }
          iVar5 = __ptr[(int)(iVar4 - (uVar8 & 0x1fffffff))];
          iVar4 = __ptr[(int)(iVar4 - (uVar13 & 0x1fffffff))];
          if ((uVar8 >> 0x1e & 1) == 0) {
            if ((uVar10 & 0x4000000000000000) != 0) {
              iVar6 = iVar4 + DelayC;
              if (iVar4 + DelayC <= iVar5 + 100) {
                iVar6 = iVar5 + 100;
              }
              goto LAB_0067765e;
            }
            iVar6 = iVar4 + 100;
            if (iVar4 + 100 < iVar5 + 100) {
              iVar6 = iVar5 + 100;
            }
          }
          else {
            iVar6 = iVar4 + 100;
            if (iVar4 + 100 < iVar5 + DelayC) {
              iVar6 = iVar5 + DelayC;
            }
LAB_0067765e:
            iVar9 = iVar9 + 1;
          }
          __ptr[uVar14] = iVar6;
        }
        else {
          iVar4 = __ptr[(int)(iVar4 - (uVar8 & 0x1fffffff))];
          __ptr[uVar14] = iVar4;
          if (iVar11 <= iVar4) {
            iVar11 = iVar4;
          }
        }
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < (long)p->nObjs);
  }
  if (pnBoxes != (int *)0x0) {
    *pnBoxes = iVar9;
  }
  return iVar11;
}

Assistant:

int Gia_ManFindAnnotatedDelay( Gia_Man_t * p, int DelayC, int * pnBoxes, int fIgnoreBoxDelays )
{
    Gia_Obj_t * pObj;
    int nRealPis = Gia_ManBoxNum(p) ? Tim_ManPiNum((Tim_Man_t *)p->pManTime) : Gia_ManCiNum(p);
    int * pDelays = Vec_IntArray(p->vLevels);
    int i, k, iBox, iBoxOutId, Delay, Delay0, Delay1, DelayMax = 0, nBoxes = 0;
    Vec_IntFill( p->vLevels, Gia_ManObjNum(p), 0 );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            if ( fIgnoreBoxDelays )
                continue;
            // check if it is real PI
            iBoxOutId = Gia_ObjCioId(pObj) - nRealPis;
            if ( iBoxOutId < 0 )
                continue;
            // if it is a box output, find box number
            iBox = iBoxOutId / 2;
            assert( iBox < Gia_ManBoxNum(p) );
            // check find the maximum delay of the box inputs
            Delay = 0;
            for ( k = 0; k < 3; k++ )
            {
                int Id = Gia_ObjId( p, Gia_ManCo(p, iBox*3+k) );
                assert( Id < i );
                Delay = Abc_MaxInt( Delay, pDelays[Id] );
            }
            // consider outputs
            if ( iBoxOutId & 1 ) // carry output
                Delay += DelayC;
            else // sum output
                Delay += 100;
            pDelays[i] = Delay;
            continue;
        }
        if ( Gia_ObjIsCo(pObj) )
        {
            pDelays[i] = pDelays[Gia_ObjFaninId0(pObj, i)];
            DelayMax = Abc_MaxInt( DelayMax, pDelays[i] );
            continue;
        }
        assert( !pObj->fMark0 || !pObj->fMark1 );
        Delay0 = pDelays[Gia_ObjFaninId0(pObj, i)];
        Delay1 = pDelays[Gia_ObjFaninId1(pObj, i)];
        if ( pObj->fMark0 )
        {
            Delay = Abc_MaxInt( Delay0 + DelayC, Delay1 + 100 );
            nBoxes++;
        }
        else if ( pObj->fMark1 )
        {
            Delay = Abc_MaxInt( Delay1 + DelayC, Delay0 + 100 );
            nBoxes++;
        }
        else
            Delay = Abc_MaxInt( Delay0 + 100, Delay1 + 100 );
        pDelays[i] = Delay;
    }
    if ( pnBoxes )
        *pnBoxes = nBoxes;
    return DelayMax;
}